

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O1

bool xray_re::xr_ini_file::is_true(char *value)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = strcasecmp(value,"true");
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = strcasecmp(value,"on");
    if (iVar1 != 0) {
      iVar1 = strcasecmp(value,"yes");
      if (iVar1 != 0) {
        iVar1 = strcmp(value,"1");
        bVar2 = iVar1 == 0;
      }
    }
  }
  return bVar2;
}

Assistant:

bool xr_ini_file::is_true(const char* value)
{
	if (xr_stricmp(value, "true") == 0 || xr_stricmp(value, "on") == 0 ||
			xr_stricmp(value, "yes") == 0 || std::strcmp(value, "1") == 0) {
		return true;
	}
	return false;
}